

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CImg.h
# Opt level: O1

CImg<unsigned_char> * __thiscall
cimg_library::CImg<unsigned_char>::_load_pfm(CImg<unsigned_char> *this,FILE *file,char *filename)

{
  float fVar1;
  double dVar2;
  int iVar3;
  uint uVar4;
  FILE *__stream;
  CImg<unsigned_char> *pCVar5;
  CImgArgumentException *this_00;
  CImgIOException *this_01;
  float *pfVar6;
  uchar *puVar7;
  char *pcVar8;
  char *pcVar9;
  uchar *puVar10;
  long lVar11;
  uchar *puVar12;
  int W;
  char pfm_type;
  int H;
  CImg<float> buf;
  CImg<char> item;
  double scale;
  FILE *local_38;
  
  if (file == (FILE *)0x0 && filename == (char *)0x0) {
    this_00 = (CImgArgumentException *)__cxa_allocate_exception(0x10);
    pcVar8 = "non-";
    if (this->_is_shared != false) {
      pcVar8 = "";
    }
    CImgArgumentException::CImgArgumentException
              (this_00,
               "[instance(%u,%u,%u,%u,%p,%sshared)] CImg<%s>::load_pfm(): Specified filename is (null)."
               ,(ulong)this->_width,(ulong)this->_height,(ulong)this->_depth,(ulong)this->_spectrum,
               this->_data,pcVar8,"unsigned char");
    __cxa_throw(this_00,&CImgArgumentException::typeinfo,CImgException::~CImgException);
  }
  __stream = (FILE *)file;
  if (file == (FILE *)0x0) {
    __stream = cimg::fopen(filename,"rb");
  }
  buf._width._0_1_ = 0;
  CImg<char>::CImg(&item,0x4000,1,1,1,(char *)&buf);
  W = 0;
  H = 0;
  scale = 0.0;
  while ((iVar3 = __isoc99_fscanf(__stream,"%16383[^\n]",item._data), iVar3 != -1 &&
         (iVar3 == 0 || *item._data == '#'))) {
    fgetc(__stream);
  }
  iVar3 = __isoc99_sscanf(item._data," P%c",&pfm_type);
  if (iVar3 == 1) {
    while ((iVar3 = __isoc99_fscanf(__stream," %16383[^\n]",item._data), iVar3 != -1 &&
           (iVar3 == 0 || *item._data == '#'))) {
      fgetc(__stream);
    }
    iVar3 = __isoc99_sscanf(item._data," %d %d",&W,&H);
    if (1 < iVar3) {
      if (iVar3 == 2) {
        while ((iVar3 = __isoc99_fscanf(__stream," %16383[^\n]",item._data), iVar3 != -1 &&
               (iVar3 == 0 || *item._data == '#'))) {
          fgetc(__stream);
        }
        iVar3 = __isoc99_sscanf(item._data,"%lf",&scale);
        if (iVar3 != 1) {
          pcVar8 = "non-";
          if (this->_is_shared != false) {
            pcVar8 = "";
          }
          pcVar9 = "(FILE*)";
          if (filename != (char *)0x0) {
            pcVar9 = filename;
          }
          cimg::warn("[instance(%u,%u,%u,%u,%p,%sshared)] CImg<%s>::load_pfm(): SCALE field is undefined in file \'%s\'."
                     ,(ulong)this->_width,(ulong)this->_height,(ulong)this->_depth,
                     (ulong)this->_spectrum,this->_data,pcVar8,"unsigned char",pcVar9);
        }
      }
      fgetc(__stream);
      dVar2 = scale;
      if (pfm_type == 'F') {
        buf._width._0_1_ = 0;
        pCVar5 = assign(this,W,H,1,3);
        local_38 = file;
        fill(pCVar5,(uchar *)&buf);
        CImg<float>::CImg(&buf,W * 3,1,1,1);
        if (0 < (int)this->_height) {
          puVar10 = this->_data;
          lVar11 = (ulong)this->_depth * (ulong)this->_width * (ulong)this->_height;
          puVar7 = puVar10 + lVar11 * 2;
          puVar12 = puVar10 + lVar11;
          iVar3 = 0;
          do {
            cimg::fread<float>(buf._data,(long)W * 3,(FILE *)__stream);
            if ((0.0 < dVar2) && (0 < W)) {
              pfVar6 = buf._data + (ulong)(uint)W * 3;
              do {
                fVar1 = pfVar6[-1];
                pfVar6[-1] = (float)((uint)fVar1 >> 0x18 | ((uint)fVar1 & 0xff0000) >> 8 |
                                     ((uint)fVar1 & 0xff00) << 8 | (int)fVar1 << 0x18);
                pfVar6 = pfVar6 + -1;
              } while (buf._data < pfVar6);
            }
            if (0 < (int)this->_width) {
              lVar11 = 0;
              pfVar6 = buf._data;
              do {
                puVar10[lVar11] = (uchar)(int)*pfVar6;
                puVar12[lVar11] = (uchar)(int)pfVar6[1];
                puVar7[lVar11] = (uchar)(int)pfVar6[2];
                lVar11 = lVar11 + 1;
                pfVar6 = pfVar6 + 3;
              } while ((int)lVar11 < (int)this->_width);
              puVar7 = puVar7 + lVar11;
              puVar12 = puVar12 + lVar11;
              puVar10 = puVar10 + lVar11;
            }
            iVar3 = iVar3 + 1;
          } while (iVar3 < (int)this->_height);
        }
        file = local_38;
        if ((buf._is_shared == false) && (buf._data != (float *)0x0)) {
          operator_delete__(buf._data);
          file = local_38;
        }
      }
      else {
        buf._width._0_1_ = 0;
        pCVar5 = assign(this,W,H,1,1);
        fill(pCVar5,(uchar *)&buf);
        CImg<float>::CImg(&buf,W,1,1,1);
        if (0 < (int)this->_height) {
          puVar7 = this->_data;
          iVar3 = 0;
          do {
            cimg::fread<float>(buf._data,(long)W,(FILE *)__stream);
            if ((0.0 < dVar2) && (0 < (long)W)) {
              pfVar6 = buf._data + W;
              do {
                fVar1 = pfVar6[-1];
                pfVar6[-1] = (float)((uint)fVar1 >> 0x18 | ((uint)fVar1 & 0xff0000) >> 8 |
                                     ((uint)fVar1 & 0xff00) << 8 | (int)fVar1 << 0x18);
                pfVar6 = pfVar6 + -1;
              } while (buf._data < pfVar6);
            }
            if (0 < (int)this->_width) {
              lVar11 = 0;
              do {
                puVar7[lVar11] = (uchar)(int)buf._data[lVar11];
                lVar11 = lVar11 + 1;
              } while ((int)lVar11 < (int)this->_width);
              puVar7 = puVar7 + lVar11;
            }
            iVar3 = iVar3 + 1;
          } while (iVar3 < (int)this->_height);
        }
        if ((buf._is_shared == false) && (buf._data != (float *)0x0)) {
          operator_delete__(buf._data);
        }
      }
      if (file == (FILE *)0x0) {
        if (__stream == (FILE *)0x0) {
          cimg::warn("cimg::fclose(): Specified file is (null).");
        }
        else if (((_stdin != __stream) && (_stdout != __stream)) &&
                (uVar4 = fclose(__stream), uVar4 != 0)) {
          cimg::warn("cimg::fclose(): Error code %d returned during file closing.",(ulong)uVar4);
        }
      }
      pCVar5 = mirror(this,'y');
      if ((item._is_shared == false) && (item._data != (char *)0x0)) {
        operator_delete__(item._data);
      }
      return pCVar5;
    }
    if (file == (FILE *)0x0) {
      cimg::fclose(__stream);
    }
    this_01 = (CImgIOException *)__cxa_allocate_exception(0x10);
    pcVar8 = "non-";
    if (this->_is_shared != false) {
      pcVar8 = "";
    }
    pcVar9 = "(FILE*)";
    if (filename != (char *)0x0) {
      pcVar9 = filename;
    }
    CImgIOException::CImgIOException
              (this_01,
               "[instance(%u,%u,%u,%u,%p,%sshared)] CImg<%s>::load_pfm(): WIDTH and HEIGHT fields are undefined in file \'%s\'."
               ,(ulong)this->_width,(ulong)this->_height,(ulong)this->_depth,(ulong)this->_spectrum,
               this->_data,pcVar8,"unsigned char",pcVar9);
  }
  else {
    if (file == (FILE *)0x0) {
      cimg::fclose(__stream);
    }
    this_01 = (CImgIOException *)__cxa_allocate_exception(0x10);
    pcVar8 = "non-";
    if (this->_is_shared != false) {
      pcVar8 = "";
    }
    pcVar9 = "(FILE*)";
    if (filename != (char *)0x0) {
      pcVar9 = filename;
    }
    CImgIOException::CImgIOException
              (this_01,
               "[instance(%u,%u,%u,%u,%p,%sshared)] CImg<%s>::load_pfm(): PFM header not found in file \'%s\'."
               ,(ulong)this->_width,(ulong)this->_height,(ulong)this->_depth,(ulong)this->_spectrum,
               this->_data,pcVar8,"unsigned char",pcVar9);
  }
  __cxa_throw(this_01,&CImgIOException::typeinfo,CImgException::~CImgException);
}

Assistant:

CImg<T>& _load_pfm(std::FILE *const file, const char *const filename) {
      if (!file && !filename)
        throw CImgArgumentException(_cimg_instance
                                    "load_pfm(): Specified filename is (null).",
                                    cimg_instance);

      std::FILE *const nfile = file?file:cimg::fopen(filename,"rb");
      char pfm_type;
      CImg<charT> item(16384,1,1,1,0);
      int W = 0, H = 0, err = 0;
      double scale = 0;
      while ((err=std::fscanf(nfile,"%16383[^\n]",item.data()))!=EOF && (*item=='#' || !err)) std::fgetc(nfile);
      if (cimg_sscanf(item," P%c",&pfm_type)!=1) {
        if (!file) cimg::fclose(nfile);
        throw CImgIOException(_cimg_instance
                              "load_pfm(): PFM header not found in file '%s'.",
                              cimg_instance,
                              filename?filename:"(FILE*)");
      }
      while ((err=std::fscanf(nfile," %16383[^\n]",item.data()))!=EOF && (*item=='#' || !err)) std::fgetc(nfile);
      if ((err=cimg_sscanf(item," %d %d",&W,&H))<2) {
        if (!file) cimg::fclose(nfile);
        throw CImgIOException(_cimg_instance
                              "load_pfm(): WIDTH and HEIGHT fields are undefined in file '%s'.",
                              cimg_instance,
                              filename?filename:"(FILE*)");
      }
      if (err==2) {
        while ((err=std::fscanf(nfile," %16383[^\n]",item.data()))!=EOF && (*item=='#' || !err)) std::fgetc(nfile);
        if (cimg_sscanf(item,"%lf",&scale)!=1)
          cimg::warn(_cimg_instance
                     "load_pfm(): SCALE field is undefined in file '%s'.",
                     cimg_instance,
                     filename?filename:"(FILE*)");
      }
      std::fgetc(nfile);
      const bool is_color = (pfm_type=='F'), is_inverted = (scale>0)!=cimg::endianness();
      if (is_color) {
        assign(W,H,1,3,0);
        CImg<floatT> buf(3*W);
        T *ptr_r = data(0,0,0,0), *ptr_g = data(0,0,0,1), *ptr_b = data(0,0,0,2);
        cimg_forY(*this,y) {
          cimg::fread(buf._data,3*W,nfile);
          if (is_inverted) cimg::invert_endianness(buf._data,3*W);
          const float *ptrs = buf._data;
          cimg_forX(*this,x) {
            *(ptr_r++) = (T)*(ptrs++);
            *(ptr_g++) = (T)*(ptrs++);
            *(ptr_b++) = (T)*(ptrs++);
          }
        }
      } else {
        assign(W,H,1,1,0);
        CImg<floatT> buf(W);
        T *ptrd = data(0,0,0,0);
        cimg_forY(*this,y) {
          cimg::fread(buf._data,W,nfile);
          if (is_inverted) cimg::invert_endianness(buf._data,W);
          const float *ptrs = buf._data;
          cimg_forX(*this,x) *(ptrd++) = (T)*(ptrs++);
        }
      }
      if (!file) cimg::fclose(nfile);
      return mirror('y');  // Most of the .pfm files are flipped along the y-axis.
    }